

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# omptarget.cpp
# Opt level: O0

int target_data_end(DeviceTy *Device,int32_t arg_num,void **args_base,void **args,int64_t *arg_sizes
                   ,int64_t *arg_types)

{
  ulong uVar1;
  bool bVar2;
  pointer ppVar3;
  long in_RCX;
  int in_ESI;
  long in_R8;
  long in_R9;
  bool bVar4;
  int rt_1;
  void **ShadowHstPtrAddr;
  iterator it;
  uintptr_t ub;
  uintptr_t lb;
  int rt;
  long parent_rc;
  short parent_idx;
  bool CopyMember;
  bool Always;
  bool DelEntry;
  void *TgtPtrBegin;
  bool ForceDelete;
  bool UpdateRef;
  bool IsLast;
  void *HstPtrBegin;
  int32_t i;
  int rc;
  undefined2 in_stack_ffffffffffffff58;
  undefined1 uVar5;
  undefined1 uVar6;
  int in_stack_ffffffffffffff5c;
  iterator in_stack_ffffffffffffff60;
  _Base_ptr in_stack_ffffffffffffff68;
  _Self __position;
  DeviceTy *in_stack_ffffffffffffff70;
  _Self local_88;
  iterator in_stack_ffffffffffffff80;
  DeviceTy *in_stack_ffffffffffffff88;
  DeviceTy *in_stack_ffffffffffffff90;
  DeviceTy *Size;
  undefined4 in_stack_ffffffffffffff98;
  int32_t in_stack_ffffffffffffff9c;
  DeviceTy *in_stack_ffffffffffffffa0;
  byte local_41;
  int local_38;
  int local_34;
  
  local_34 = 0;
  local_38 = in_ESI + -1;
  do {
    if (local_38 < 0) {
      return local_34;
    }
    if (((*(ulong *)(in_R9 + (long)local_38 * 8) & 0x100) == 0) &&
       ((*(ulong *)(in_R9 + (long)local_38 * 8) & 0x80) == 0)) {
      Size = *(DeviceTy **)(in_RCX + (long)local_38 * 8);
      uVar6 = true;
      if ((*(ulong *)(in_R9 + (long)local_38 * 8) & 0xffff000000000000) != 0) {
        uVar6 = (*(ulong *)(in_R9 + (long)local_38 * 8) & 0x10) != 0;
      }
      uVar1 = *(ulong *)(in_R9 + (long)local_38 * 8);
      DeviceTy::getTgtPtrBegin
                (in_stack_ffffffffffffffa0,
                 (void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                 (int64_t)in_stack_ffffffffffffff90,(bool *)in_stack_ffffffffffffff88,
                 SUB81((ulong)in_stack_ffffffffffffff80._M_node >> 0x38,0));
      uVar5 = (local_41 & 1) != 0 || (uVar1 & 8) != 0;
      bVar2 = (bool)uVar5;
      if (((*(ulong *)(in_R9 + (long)local_38 * 8) & 0xffff000000000000) != 0) &&
         ((*(ulong *)(in_R9 + (long)local_38 * 8) & 0x10) == 0)) {
        bVar2 = false;
      }
      if (((*(ulong *)(in_R9 + (long)local_38 * 8) & 2) != 0) || (bVar2)) {
        if ((*(ulong *)(in_R9 + (long)local_38 * 8) & 2) != 0) {
          uVar1 = *(ulong *)(in_R9 + (long)local_38 * 8);
          bVar4 = false;
          if (((*(ulong *)(in_R9 + (long)local_38 * 8) & 0xffff000000000000) != 0) &&
             ((*(ulong *)(in_R9 + (long)local_38 * 8) & 0x10) == 0)) {
            member_of(*(int64_t *)(in_R9 + (long)local_38 * 8));
            in_stack_ffffffffffffffa0 =
                 (DeviceTy *)
                 DeviceTy::getMapEntryRefCnt(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
            bVar4 = in_stack_ffffffffffffffa0 == (DeviceTy *)0x1;
          }
          if ((((bVar2) || ((uVar1 & 4) != 0)) || (bVar4)) &&
             (in_stack_ffffffffffffff9c =
                   DeviceTy::data_retrieve
                             (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                              in_stack_ffffffffffffff60._M_node,
                              CONCAT44(in_stack_ffffffffffffff5c,
                                       CONCAT13(uVar6,CONCAT12(uVar5,in_stack_ffffffffffffff58)))),
             in_stack_ffffffffffffff9c != 0)) {
            local_34 = -1;
          }
        }
        in_stack_ffffffffffffff88 =
             (DeviceTy *)((long)&Size->DeviceID + *(long *)(in_R8 + (long)local_38 * 8));
        std::mutex::lock((mutex *)in_stack_ffffffffffffff60._M_node);
        in_stack_ffffffffffffff80 =
             std::
             map<void_*,_ShadowPtrValTy,_std::less<void_*>,_std::allocator<std::pair<void_*const,_ShadowPtrValTy>_>_>
             ::begin((map<void_*,_ShadowPtrValTy,_std::less<void_*>,_std::allocator<std::pair<void_*const,_ShadowPtrValTy>_>_>
                      *)CONCAT44(in_stack_ffffffffffffff5c,
                                 CONCAT13(uVar6,CONCAT12(uVar5,in_stack_ffffffffffffff58))));
        while( true ) {
          local_88._M_node =
               (_Base_ptr)
               std::
               map<void_*,_ShadowPtrValTy,_std::less<void_*>,_std::allocator<std::pair<void_*const,_ShadowPtrValTy>_>_>
               ::end((map<void_*,_ShadowPtrValTy,_std::less<void_*>,_std::allocator<std::pair<void_*const,_ShadowPtrValTy>_>_>
                      *)CONCAT44(in_stack_ffffffffffffff5c,
                                 CONCAT13(uVar6,CONCAT12(uVar5,in_stack_ffffffffffffff58))));
          bVar4 = std::operator!=((_Self *)&stack0xffffffffffffff80,&local_88);
          if (!bVar4) break;
          ppVar3 = std::_Rb_tree_iterator<std::pair<void_*const,_ShadowPtrValTy>_>::operator->
                             ((_Rb_tree_iterator<std::pair<void_*const,_ShadowPtrValTy>_> *)0x10690d
                             );
          in_stack_ffffffffffffff70 = (DeviceTy *)ppVar3->first;
          if (Size <= in_stack_ffffffffffffff70) {
            if (in_stack_ffffffffffffff88 <= in_stack_ffffffffffffff70) break;
            __position._M_node = in_stack_ffffffffffffff80._M_node;
            if ((*(ulong *)(in_R9 + (long)local_38 * 8) & 2) != 0) {
              ppVar3 = std::_Rb_tree_iterator<std::pair<void_*const,_ShadowPtrValTy>_>::operator->
                                 ((_Rb_tree_iterator<std::pair<void_*const,_ShadowPtrValTy>_> *)
                                  0x106953);
              *(void **)in_stack_ffffffffffffff70 = (ppVar3->second).HstPtrVal;
              __position._M_node = in_stack_ffffffffffffff80._M_node;
            }
            in_stack_ffffffffffffff80._M_node = __position._M_node;
            if (bVar2) {
              in_stack_ffffffffffffff60 =
                   std::
                   map<void*,ShadowPtrValTy,std::less<void*>,std::allocator<std::pair<void*const,ShadowPtrValTy>>>
                   ::erase_abi_cxx11_(in_stack_ffffffffffffff60._M_node,__position._M_node);
              in_stack_ffffffffffffff68 = __position._M_node;
            }
          }
          std::_Rb_tree_iterator<std::pair<void_*const,_ShadowPtrValTy>_>::operator++
                    ((_Rb_tree_iterator<std::pair<void_*const,_ShadowPtrValTy>_> *)
                     in_stack_ffffffffffffff60._M_node);
        }
        std::mutex::unlock((mutex *)0x1069b0);
        in_stack_ffffffffffffff90 = Size;
        if ((bVar2) &&
           (in_stack_ffffffffffffff5c =
                 DeviceTy::deallocTgtPtr
                           (in_stack_ffffffffffffffa0,
                            (void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                            (int64_t)Size,SUB81((ulong)in_stack_ffffffffffffff88 >> 0x38,0)),
           in_stack_ffffffffffffff90 = Size, in_stack_ffffffffffffff5c != 0)) {
          local_34 = -1;
        }
      }
    }
    local_38 = local_38 + -1;
  } while( true );
}

Assistant:

static int target_data_end(DeviceTy &Device, int32_t arg_num, void **args_base,
    void **args, int64_t *arg_sizes, int64_t *arg_types) {
  int rc = OFFLOAD_SUCCESS;
  // process each input.
  for (int32_t i = arg_num - 1; i >= 0; --i) {
    // Ignore private variables and arrays - there is no mapping for them.
    // Also, ignore the use_device_ptr directive, it has no effect here.
    if ((arg_types[i] & OMP_TGT_MAPTYPE_LITERAL) ||
        (arg_types[i] & OMP_TGT_MAPTYPE_PRIVATE))
      continue;

    void *HstPtrBegin = args[i];
    bool IsLast;
    bool UpdateRef = !(arg_types[i] & OMP_TGT_MAPTYPE_MEMBER_OF) ||
        (arg_types[i] & OMP_TGT_MAPTYPE_PTR_AND_OBJ);
    bool ForceDelete = arg_types[i] & OMP_TGT_MAPTYPE_DELETE;

    // If PTR_AND_OBJ, HstPtrBegin is address of pointee
    void *TgtPtrBegin = Device.getTgtPtrBegin(HstPtrBegin, arg_sizes[i], IsLast,
        UpdateRef);
    DP("There are %" PRId64 " bytes allocated at target address " DPxMOD
        " - is%s last\n", arg_sizes[i], DPxPTR(TgtPtrBegin),
        (IsLast ? "" : " not"));

    bool DelEntry = IsLast || ForceDelete;

    if ((arg_types[i] & OMP_TGT_MAPTYPE_MEMBER_OF) &&
        !(arg_types[i] & OMP_TGT_MAPTYPE_PTR_AND_OBJ)) {
      DelEntry = false; // protect parent struct from being deallocated
    }

    if ((arg_types[i] & OMP_TGT_MAPTYPE_FROM) || DelEntry) {
      // Move data back to the host
      if (arg_types[i] & OMP_TGT_MAPTYPE_FROM) {
        bool Always = arg_types[i] & OMP_TGT_MAPTYPE_ALWAYS;
        bool CopyMember = false;
        if ((arg_types[i] & OMP_TGT_MAPTYPE_MEMBER_OF) &&
            !(arg_types[i] & OMP_TGT_MAPTYPE_PTR_AND_OBJ)) {
          // Copy data only if the "parent" struct has RefCount==1.
          short parent_idx = member_of(arg_types[i]);
          long parent_rc = Device.getMapEntryRefCnt(args[parent_idx]);
          assert(parent_rc > 0 && "parent struct not found");
          if (parent_rc == 1) {
            CopyMember = true;
          }
        }

        if (DelEntry || Always || CopyMember) {
          DP("Moving %" PRId64 " bytes (tgt:" DPxMOD ") -> (hst:" DPxMOD ")\n",
              arg_sizes[i], DPxPTR(TgtPtrBegin), DPxPTR(HstPtrBegin));
          int rt = Device.data_retrieve(HstPtrBegin, TgtPtrBegin, arg_sizes[i]);
          if (rt != OFFLOAD_SUCCESS) {
            DP("Copying data from device failed.\n");
            rc = OFFLOAD_FAIL;
          }
        }
      }

      // If we copied back to the host a struct/array containing pointers, we
      // need to restore the original host pointer values from their shadow
      // copies. If the struct is going to be deallocated, remove any remaining
      // shadow pointer entries for this struct.
      uintptr_t lb = (uintptr_t) HstPtrBegin;
      uintptr_t ub = (uintptr_t) HstPtrBegin + arg_sizes[i];
      Device.ShadowMtx.lock();
      for (ShadowPtrListTy::iterator it = Device.ShadowPtrMap.begin();
          it != Device.ShadowPtrMap.end(); ++it) {
        void **ShadowHstPtrAddr = (void**) it->first;

        // An STL map is sorted on its keys; use this property
        // to quickly determine when to break out of the loop.
        if ((uintptr_t) ShadowHstPtrAddr < lb)
          continue;
        if ((uintptr_t) ShadowHstPtrAddr >= ub)
          break;

        // If we copied the struct to the host, we need to restore the pointer.
        if (arg_types[i] & OMP_TGT_MAPTYPE_FROM) {
          DP("Restoring original host pointer value " DPxMOD " for host "
              "pointer " DPxMOD "\n", DPxPTR(it->second.HstPtrVal),
              DPxPTR(ShadowHstPtrAddr));
          *ShadowHstPtrAddr = it->second.HstPtrVal;
        }
        // If the struct is to be deallocated, remove the shadow entry.
        if (DelEntry) {
          DP("Removing shadow pointer " DPxMOD "\n", DPxPTR(ShadowHstPtrAddr));
          Device.ShadowPtrMap.erase(it);
        }
      }
      Device.ShadowMtx.unlock();

      // Deallocate map
      if (DelEntry) {
        int rt = Device.deallocTgtPtr(HstPtrBegin, arg_sizes[i], ForceDelete);
        if (rt != OFFLOAD_SUCCESS) {
          DP("Deallocating data from device failed.\n");
          rc = OFFLOAD_FAIL;
        }
      }
    }
  }

  return rc;
}